

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl4cShaderStorageBufferObjectTests.cpp
# Opt level: O0

long __thiscall gl4cts::anon_unknown_0::AdvancedUsageCase1::Run(AdvancedUsageCase1 *this)

{
  bool bVar1;
  GLuint GVar2;
  float *local_328;
  Vector<float,_3> local_2f8;
  Vector<float,_3> local_2ec;
  Vector<float,_3> local_2e0;
  Vector<float,_3> local_2d4;
  GLsizei local_2c8 [2];
  GLsizei count [4];
  GLint first [4];
  anon_struct_12_2_df4dc4dd data_3 [16];
  int data_2 [4];
  vec4 data_1 [4];
  undefined1 local_188 [8];
  mat4 data [4];
  string local_80;
  allocator<char> local_49;
  string local_48;
  char *local_28;
  char *glsl_fs;
  char *glsl_vs;
  AdvancedUsageCase1 *this_local;
  
  glsl_vs = (char *)this;
  bVar1 = ShaderStorageBufferObjectBase::SupportedInVS(&this->super_ShaderStorageBufferObjectBase,1)
  ;
  if (bVar1) {
    glsl_fs = 
    "\nlayout(location = 0) in vec4 g_position;\nlayout(location = 1) in int g_object_id;\nout StageData {\n  flat int object_id;\n} g_vs_out;\nlayout(binding = 0, std430) buffer TransformBuffer {\n  mat4 g_transform[];\n};\nvoid main() {\n  mat4 mvp = g_transform[g_object_id];\n  gl_Position = mvp * g_position;\n  g_vs_out.object_id = g_object_id;\n}"
    ;
    local_28 = 
    "\nin StageData {\n  flat int object_id;\n} g_fs_in;\nlayout(location = 0) out vec4 g_fs_out;\nstruct Material {\n  vec3 color;\n};\nlayout(binding = 1, std430) buffer MaterialBuffer {\n  Material g_material[4];\n};\nlayout(binding = 2, std430) buffer MaterialIDBuffer {\n  int g_material_id[4];\n};\nvoid main() {\n  int mid = g_material_id[g_fs_in.object_id];\n  Material m = g_material[mid];\n  g_fs_out = vec4(m.color, 1);\n}"
    ;
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_48,
               "\nlayout(location = 0) in vec4 g_position;\nlayout(location = 1) in int g_object_id;\nout StageData {\n  flat int object_id;\n} g_vs_out;\nlayout(binding = 0, std430) buffer TransformBuffer {\n  mat4 g_transform[];\n};\nvoid main() {\n  mat4 mvp = g_transform[g_object_id];\n  gl_Position = mvp * g_position;\n  g_vs_out.object_id = g_object_id;\n}"
               ,&local_49);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_80,
               "\nin StageData {\n  flat int object_id;\n} g_fs_in;\nlayout(location = 0) out vec4 g_fs_out;\nstruct Material {\n  vec3 color;\n};\nlayout(binding = 1, std430) buffer MaterialBuffer {\n  Material g_material[4];\n};\nlayout(binding = 2, std430) buffer MaterialIDBuffer {\n  int g_material_id[4];\n};\nvoid main() {\n  int mid = g_material_id[g_fs_in.object_id];\n  Material m = g_material[mid];\n  g_fs_out = vec4(m.color, 1);\n}"
               ,(allocator<char> *)((long)data[3].m_data.m_data[3].m_data + 0xf));
    GVar2 = ShaderStorageBufferObjectBase::CreateProgram
                      (&this->super_ShaderStorageBufferObjectBase,&local_48,&local_80);
    this->m_program = GVar2;
    std::__cxx11::string::~string((string *)&local_80);
    std::allocator<char>::~allocator
              ((allocator<char> *)((long)data[3].m_data.m_data[3].m_data + 0xf));
    std::__cxx11::string::~string((string *)&local_48);
    std::allocator<char>::~allocator(&local_49);
    glu::CallLogWrapper::glLinkProgram
              (&(this->super_ShaderStorageBufferObjectBase).super_SubcaseBase.super_GLWrapper.
                super_CallLogWrapper,this->m_program);
    bVar1 = ShaderStorageBufferObjectBase::CheckProgram
                      (&this->super_ShaderStorageBufferObjectBase,this->m_program);
    if (bVar1) {
      glu::CallLogWrapper::glGenBuffers
                (&(this->super_ShaderStorageBufferObjectBase).super_SubcaseBase.super_GLWrapper.
                  super_CallLogWrapper,3,this->m_storage_buffer);
      ShaderStorageBufferObjectBase::Translation
                ((mat4 *)local_188,&this->super_ShaderStorageBufferObjectBase,-0.5,-0.5,0.0);
      ShaderStorageBufferObjectBase::Translation
                ((mat4 *)(data[0].m_data.m_data[3].m_data + 2),
                 &this->super_ShaderStorageBufferObjectBase,0.5,-0.5,0.0);
      ShaderStorageBufferObjectBase::Translation
                ((mat4 *)(data[1].m_data.m_data[3].m_data + 2),
                 &this->super_ShaderStorageBufferObjectBase,-0.5,0.5,0.0);
      ShaderStorageBufferObjectBase::Translation
                ((mat4 *)(data[2].m_data.m_data[3].m_data + 2),
                 &this->super_ShaderStorageBufferObjectBase,0.5,0.5,0.0);
      glu::CallLogWrapper::glBindBufferBase
                (&(this->super_ShaderStorageBufferObjectBase).super_SubcaseBase.super_GLWrapper.
                  super_CallLogWrapper,0x90d2,0,this->m_storage_buffer[0]);
      glu::CallLogWrapper::glBufferData
                (&(this->super_ShaderStorageBufferObjectBase).super_SubcaseBase.super_GLWrapper.
                  super_CallLogWrapper,0x90d2,0x100,local_188,0x88e4);
      local_328 = data[3].m_data.m_data[3].m_data + 2;
      do {
        local_328 = local_328 + -0x10;
        tcu::Matrix<float,_4,_4>::~Matrix((Matrix<float,_4,_4> *)local_328);
      } while (local_328 != (float *)local_188);
      tcu::Vector<float,_4>::Vector((Vector<float,_4> *)(data_2 + 2),1.0,0.0,0.0,1.0);
      tcu::Vector<float,_4>::Vector((Vector<float,_4> *)(data_1[0].m_data + 2),0.0,1.0,0.0,1.0);
      tcu::Vector<float,_4>::Vector((Vector<float,_4> *)(data_1[1].m_data + 2),0.0,0.0,1.0,0.0);
      tcu::Vector<float,_4>::Vector((Vector<float,_4> *)(data_1[2].m_data + 2),1.0,1.0,0.0,1.0);
      glu::CallLogWrapper::glBindBufferBase
                (&(this->super_ShaderStorageBufferObjectBase).super_SubcaseBase.super_GLWrapper.
                  super_CallLogWrapper,0x90d2,1,this->m_storage_buffer[1]);
      glu::CallLogWrapper::glBufferData
                (&(this->super_ShaderStorageBufferObjectBase).super_SubcaseBase.super_GLWrapper.
                  super_CallLogWrapper,0x90d2,0x40,data_2 + 2,0x88e4);
      data_3[0xf].position.m_data[1] = 0.0;
      data_3[0xf].object_id = 1;
      data_2[0] = 2;
      data_2[1] = 3;
      glu::CallLogWrapper::glBindBufferBase
                (&(this->super_ShaderStorageBufferObjectBase).super_SubcaseBase.super_GLWrapper.
                  super_CallLogWrapper,0x90d2,2,this->m_storage_buffer[2]);
      glu::CallLogWrapper::glBufferData
                (&(this->super_ShaderStorageBufferObjectBase).super_SubcaseBase.super_GLWrapper.
                  super_CallLogWrapper,0x90d2,0x10,data_3[0xf].position.m_data + 1,0x88e4);
      tcu::Vector<float,_2>::Vector((Vector<float,_2> *)(first + 2),-0.4,-0.4);
      data_3[0].position.m_data[0] = 0.0;
      tcu::Vector<float,_2>::Vector((Vector<float,_2> *)(data_3[0].position.m_data + 1),0.4,-0.4);
      data_3[1].position.m_data[0] = 0.0;
      tcu::Vector<float,_2>::Vector((Vector<float,_2> *)(data_3[1].position.m_data + 1),-0.4,0.4);
      data_3[2].position.m_data[0] = 0.0;
      tcu::Vector<float,_2>::Vector((Vector<float,_2> *)(data_3[2].position.m_data + 1),0.4,0.4);
      data_3[3].position.m_data[0] = 0.0;
      tcu::Vector<float,_2>::Vector((Vector<float,_2> *)(data_3[3].position.m_data + 1),-0.4,-0.4);
      data_3[4].position.m_data[0] = 1.4013e-45;
      tcu::Vector<float,_2>::Vector((Vector<float,_2> *)(data_3[4].position.m_data + 1),0.4,-0.4);
      data_3[5].position.m_data[0] = 1.4013e-45;
      tcu::Vector<float,_2>::Vector((Vector<float,_2> *)(data_3[5].position.m_data + 1),-0.4,0.4);
      data_3[6].position.m_data[0] = 1.4013e-45;
      tcu::Vector<float,_2>::Vector((Vector<float,_2> *)(data_3[6].position.m_data + 1),0.4,0.4);
      data_3[7].position.m_data[0] = 1.4013e-45;
      tcu::Vector<float,_2>::Vector((Vector<float,_2> *)(data_3[7].position.m_data + 1),-0.4,-0.4);
      data_3[8].position.m_data[0] = 2.8026e-45;
      tcu::Vector<float,_2>::Vector((Vector<float,_2> *)(data_3[8].position.m_data + 1),0.4,-0.4);
      data_3[9].position.m_data[0] = 2.8026e-45;
      tcu::Vector<float,_2>::Vector((Vector<float,_2> *)(data_3[9].position.m_data + 1),-0.4,0.4);
      data_3[10].position.m_data[0] = 2.8026e-45;
      tcu::Vector<float,_2>::Vector((Vector<float,_2> *)(data_3[10].position.m_data + 1),0.4,0.4);
      data_3[0xb].position.m_data[0] = 2.8026e-45;
      tcu::Vector<float,_2>::Vector((Vector<float,_2> *)(data_3[0xb].position.m_data + 1),-0.4,-0.4)
      ;
      data_3[0xc].position.m_data[0] = 4.2039e-45;
      tcu::Vector<float,_2>::Vector((Vector<float,_2> *)(data_3[0xc].position.m_data + 1),0.4,-0.4);
      data_3[0xd].position.m_data[0] = 4.2039e-45;
      tcu::Vector<float,_2>::Vector((Vector<float,_2> *)(data_3[0xd].position.m_data + 1),-0.4,0.4);
      data_3[0xe].position.m_data[0] = 4.2039e-45;
      tcu::Vector<float,_2>::Vector((Vector<float,_2> *)(data_3[0xe].position.m_data + 1),0.4,0.4);
      data_3[0xf].position.m_data[0] = 4.2039e-45;
      glu::CallLogWrapper::glGenBuffers
                (&(this->super_ShaderStorageBufferObjectBase).super_SubcaseBase.super_GLWrapper.
                  super_CallLogWrapper,1,&this->m_vertex_buffer);
      glu::CallLogWrapper::glBindBuffer
                (&(this->super_ShaderStorageBufferObjectBase).super_SubcaseBase.super_GLWrapper.
                  super_CallLogWrapper,0x8892,this->m_vertex_buffer);
      glu::CallLogWrapper::glBufferData
                (&(this->super_ShaderStorageBufferObjectBase).super_SubcaseBase.super_GLWrapper.
                  super_CallLogWrapper,0x8892,0xc0,first + 2,0x88e4);
      glu::CallLogWrapper::glBindBuffer
                (&(this->super_ShaderStorageBufferObjectBase).super_SubcaseBase.super_GLWrapper.
                  super_CallLogWrapper,0x8892,0);
      glu::CallLogWrapper::glBindTexture
                (&(this->super_ShaderStorageBufferObjectBase).super_SubcaseBase.super_GLWrapper.
                  super_CallLogWrapper,0xde1,this->m_rt);
      glu::CallLogWrapper::glTexParameteri
                (&(this->super_ShaderStorageBufferObjectBase).super_SubcaseBase.super_GLWrapper.
                  super_CallLogWrapper,0xde1,0x2801,0x2601);
      glu::CallLogWrapper::glTexParameteri
                (&(this->super_ShaderStorageBufferObjectBase).super_SubcaseBase.super_GLWrapper.
                  super_CallLogWrapper,0xde1,0x2800,0x2601);
      glu::CallLogWrapper::glTexStorage2D
                (&(this->super_ShaderStorageBufferObjectBase).super_SubcaseBase.super_GLWrapper.
                  super_CallLogWrapper,0xde1,1,0x8058,100,100);
      glu::CallLogWrapper::glBindTexture
                (&(this->super_ShaderStorageBufferObjectBase).super_SubcaseBase.super_GLWrapper.
                  super_CallLogWrapper,0xde1,0);
      glu::CallLogWrapper::glViewport
                (&(this->super_ShaderStorageBufferObjectBase).super_SubcaseBase.super_GLWrapper.
                  super_CallLogWrapper,0,0,100,100);
      glu::CallLogWrapper::glBindFramebuffer
                (&(this->super_ShaderStorageBufferObjectBase).super_SubcaseBase.super_GLWrapper.
                  super_CallLogWrapper,0x8d40,this->m_fbo);
      glu::CallLogWrapper::glFramebufferTexture
                (&(this->super_ShaderStorageBufferObjectBase).super_SubcaseBase.super_GLWrapper.
                  super_CallLogWrapper,0x8d40,0x8ce0,this->m_rt,0);
      glu::CallLogWrapper::glGenVertexArrays
                (&(this->super_ShaderStorageBufferObjectBase).super_SubcaseBase.super_GLWrapper.
                  super_CallLogWrapper,1,&this->m_vertex_array);
      glu::CallLogWrapper::glBindVertexArray
                (&(this->super_ShaderStorageBufferObjectBase).super_SubcaseBase.super_GLWrapper.
                  super_CallLogWrapper,this->m_vertex_array);
      glu::CallLogWrapper::glBindBuffer
                (&(this->super_ShaderStorageBufferObjectBase).super_SubcaseBase.super_GLWrapper.
                  super_CallLogWrapper,0x8892,this->m_vertex_buffer);
      glu::CallLogWrapper::glVertexAttribPointer
                (&(this->super_ShaderStorageBufferObjectBase).super_SubcaseBase.super_GLWrapper.
                  super_CallLogWrapper,0,2,0x1406,'\0',0xc,(void *)0x0);
      glu::CallLogWrapper::glVertexAttribIPointer
                (&(this->super_ShaderStorageBufferObjectBase).super_SubcaseBase.super_GLWrapper.
                  super_CallLogWrapper,1,1,0x1404,0xc,(void *)0x8);
      glu::CallLogWrapper::glBindBuffer
                (&(this->super_ShaderStorageBufferObjectBase).super_SubcaseBase.super_GLWrapper.
                  super_CallLogWrapper,0x8892,0);
      glu::CallLogWrapper::glEnableVertexAttribArray
                (&(this->super_ShaderStorageBufferObjectBase).super_SubcaseBase.super_GLWrapper.
                  super_CallLogWrapper,0);
      glu::CallLogWrapper::glEnableVertexAttribArray
                (&(this->super_ShaderStorageBufferObjectBase).super_SubcaseBase.super_GLWrapper.
                  super_CallLogWrapper,1);
      glu::CallLogWrapper::glBindVertexArray
                (&(this->super_ShaderStorageBufferObjectBase).super_SubcaseBase.super_GLWrapper.
                  super_CallLogWrapper,0);
      glu::CallLogWrapper::glClear
                (&(this->super_ShaderStorageBufferObjectBase).super_SubcaseBase.super_GLWrapper.
                  super_CallLogWrapper,0x4000);
      glu::CallLogWrapper::glUseProgram
                (&(this->super_ShaderStorageBufferObjectBase).super_SubcaseBase.super_GLWrapper.
                  super_CallLogWrapper,this->m_program);
      glu::CallLogWrapper::glBindVertexArray
                (&(this->super_ShaderStorageBufferObjectBase).super_SubcaseBase.super_GLWrapper.
                  super_CallLogWrapper,this->m_vertex_array);
      count[2] = 0;
      count[3] = 4;
      first[0] = 8;
      first[1] = 0xc;
      local_2c8[0] = 4;
      local_2c8[1] = 4;
      count[0] = 4;
      count[1] = 4;
      glu::CallLogWrapper::glMultiDrawArrays
                (&(this->super_ShaderStorageBufferObjectBase).super_SubcaseBase.super_GLWrapper.
                  super_CallLogWrapper,5,count + 2,local_2c8,4);
      tcu::Vector<float,_3>::Vector(&local_2d4,1.0,0.0,0.0);
      tcu::Vector<float,_3>::Vector(&local_2e0,0.0,1.0,0.0);
      tcu::Vector<float,_3>::Vector(&local_2ec,1.0,1.0,0.0);
      tcu::Vector<float,_3>::Vector(&local_2f8,0.0,0.0,1.0);
      bVar1 = ShaderStorageBufferObjectBase::ValidateWindow4Quads
                        (&this->super_ShaderStorageBufferObjectBase,&local_2d4,&local_2e0,&local_2ec
                         ,&local_2f8,(int *)0x0);
      if (((bVar1 ^ 0xffU) & 1) == 0) {
        this_local = (AdvancedUsageCase1 *)0x0;
      }
      else {
        this_local = (AdvancedUsageCase1 *)&DAT_ffffffffffffffff;
      }
    }
    else {
      this_local = (AdvancedUsageCase1 *)&DAT_ffffffffffffffff;
    }
  }
  else {
    this_local = (AdvancedUsageCase1 *)0x10;
  }
  return (long)this_local;
}

Assistant:

virtual long Run()
	{
		if (!SupportedInVS(1))
			return NOT_SUPPORTED;

		const char* const glsl_vs =
			NL "layout(location = 0) in vec4 g_position;" NL "layout(location = 1) in int g_object_id;" NL
			   "out StageData {" NL "  flat int object_id;" NL "} g_vs_out;" NL
			   "layout(binding = 0, std430) buffer TransformBuffer {" NL "  mat4 g_transform[];" NL "};" NL
			   "void main() {" NL "  mat4 mvp = g_transform[g_object_id];" NL "  gl_Position = mvp * g_position;" NL
			   "  g_vs_out.object_id = g_object_id;" NL "}";

		const char* const glsl_fs = NL
			"in StageData {" NL "  flat int object_id;" NL "} g_fs_in;" NL "layout(location = 0) out vec4 g_fs_out;" NL
			"struct Material {" NL "  vec3 color;" NL "};" NL "layout(binding = 1, std430) buffer MaterialBuffer {" NL
			"  Material g_material[4];" NL "};" NL "layout(binding = 2, std430) buffer MaterialIDBuffer {" NL
			"  int g_material_id[4];" NL "};" NL "void main() {" NL "  int mid = g_material_id[g_fs_in.object_id];" NL
			"  Material m = g_material[mid];" NL "  g_fs_out = vec4(m.color, 1);" NL "}";

		m_program = CreateProgram(glsl_vs, glsl_fs);
		glLinkProgram(m_program);
		if (!CheckProgram(m_program))
			return ERROR;

		glGenBuffers(3, m_storage_buffer);

		/* transform buffer */
		{
			mat4 data[] = { Translation(-0.5f, -0.5f, 0.0f), Translation(0.5f, -0.5f, 0.0f),
							Translation(-0.5f, 0.5f, 0.0f), Translation(0.5f, 0.5f, 0.0f) };
			glBindBufferBase(GL_SHADER_STORAGE_BUFFER, 0, m_storage_buffer[0]);
			glBufferData(GL_SHADER_STORAGE_BUFFER, sizeof(data), data, GL_STATIC_DRAW);
		}
		/* material buffer */
		{
			vec4 data[] = { vec4(1, 0, 0, 1), vec4(0, 1, 0, 1), vec4(0, 0, 1, 0), vec4(1, 1, 0, 1) };
			glBindBufferBase(GL_SHADER_STORAGE_BUFFER, 1, m_storage_buffer[1]);
			glBufferData(GL_SHADER_STORAGE_BUFFER, sizeof(data), data, GL_STATIC_DRAW);
		}
		/* material id buffer */
		{
			int data[] = { 0, 1, 2, 3 };
			glBindBufferBase(GL_SHADER_STORAGE_BUFFER, 2, m_storage_buffer[2]);
			glBufferData(GL_SHADER_STORAGE_BUFFER, sizeof(data), data, GL_STATIC_DRAW);
		}
		/* vertex buffer */
		{
			struct
			{
				vec2 position;
				int  object_id;
			} data[] = { { vec2(-0.4f, -0.4f), 0 }, { vec2(0.4f, -0.4f), 0 },  { vec2(-0.4f, 0.4f), 0 },
						 { vec2(0.4f, 0.4f), 0 },   { vec2(-0.4f, -0.4f), 1 }, { vec2(0.4f, -0.4f), 1 },
						 { vec2(-0.4f, 0.4f), 1 },  { vec2(0.4f, 0.4f), 1 },   { vec2(-0.4f, -0.4f), 2 },
						 { vec2(0.4f, -0.4f), 2 },  { vec2(-0.4f, 0.4f), 2 },  { vec2(0.4f, 0.4f), 2 },
						 { vec2(-0.4f, -0.4f), 3 }, { vec2(0.4f, -0.4f), 3 },  { vec2(-0.4f, 0.4f), 3 },
						 { vec2(0.4f, 0.4f), 3 } };
			glGenBuffers(1, &m_vertex_buffer);
			glBindBuffer(GL_ARRAY_BUFFER, m_vertex_buffer);
			glBufferData(GL_ARRAY_BUFFER, sizeof(data), data, GL_STATIC_DRAW);
			glBindBuffer(GL_ARRAY_BUFFER, 0);
		}

		glBindTexture(GL_TEXTURE_2D, m_rt);
		glTexParameteri(GL_TEXTURE_2D, GL_TEXTURE_MIN_FILTER, GL_LINEAR);
		glTexParameteri(GL_TEXTURE_2D, GL_TEXTURE_MAG_FILTER, GL_LINEAR);
		glTexStorage2D(GL_TEXTURE_2D, 1, GL_RGBA8, 100, 100);
		glBindTexture(GL_TEXTURE_2D, 0);
		glViewport(0, 0, 100, 100);
		glBindFramebuffer(GL_FRAMEBUFFER, m_fbo);
		glFramebufferTexture(GL_FRAMEBUFFER, GL_COLOR_ATTACHMENT0, m_rt, 0);

		glGenVertexArrays(1, &m_vertex_array);
		glBindVertexArray(m_vertex_array);
		glBindBuffer(GL_ARRAY_BUFFER, m_vertex_buffer);
		glVertexAttribPointer(0, 2, GL_FLOAT, GL_FALSE, sizeof(vec2) + sizeof(int), 0);
		glVertexAttribIPointer(1, 1, GL_INT, sizeof(vec2) + sizeof(int), reinterpret_cast<void*>(sizeof(vec2)));
		glBindBuffer(GL_ARRAY_BUFFER, 0);
		glEnableVertexAttribArray(0);
		glEnableVertexAttribArray(1);
		glBindVertexArray(0);

		glClear(GL_COLOR_BUFFER_BIT);
		glUseProgram(m_program);
		glBindVertexArray(m_vertex_array);
		/* draw */
		{
			const GLint   first[4] = { 0, 4, 8, 12 };
			const GLsizei count[4] = { 4, 4, 4, 4 };
			glMultiDrawArrays(GL_TRIANGLE_STRIP, first, count, 4);
		}
		if (!ValidateWindow4Quads(vec3(1, 0, 0), vec3(0, 1, 0), vec3(1, 1, 0), vec3(0, 0, 1)))
		{
			return ERROR;
		}
		return NO_ERROR;
	}